

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_socket_manager.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::utp_socket_manager::remove_socket(utp_socket_manager *this,uint16_t id)

{
  pointer puVar1;
  bool bVar2;
  pointer ppVar3;
  pointer puVar4;
  _Self local_28;
  _Self local_20;
  iterator i;
  uint16_t id_local;
  utp_socket_manager *this_local;
  
  i._M_node._6_2_ = id;
  local_20._M_node =
       (_Base_ptr)
       ::std::
       multimap<unsigned_short,_std::unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>_>_>_>
       ::find(&this->m_utp_sockets,(key_type_conflict2 *)((long)&i._M_node + 6));
  local_28._M_node =
       (_Base_ptr)
       ::std::
       multimap<unsigned_short,_std::unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>_>_>_>
       ::end(&this->m_utp_sockets);
  bVar2 = ::std::operator==(&local_20,&local_28);
  if (!bVar2) {
    puVar1 = this->m_last_socket;
    ppVar3 = ::std::
             _Rb_tree_iterator<std::pair<const_unsigned_short,_std::unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>_>_>
             ::operator->(&local_20);
    puVar4 = ::std::
             unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
             ::get(&ppVar3->second);
    if (puVar1 == puVar4) {
      this->m_last_socket = (utp_socket_impl *)0x0;
    }
    puVar1 = this->m_deferred_ack;
    ppVar3 = ::std::
             _Rb_tree_iterator<std::pair<const_unsigned_short,_std::unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>_>_>
             ::operator->(&local_20);
    puVar4 = ::std::
             unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
             ::get(&ppVar3->second);
    if (puVar1 == puVar4) {
      this->m_deferred_ack = (utp_socket_impl *)0x0;
    }
    ::std::
    multimap<unsigned_short,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>>>
    ::erase_abi_cxx11_((multimap<unsigned_short,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>>>
                        *)&this->m_utp_sockets,(iterator)local_20._M_node);
  }
  return;
}

Assistant:

void utp_socket_manager::remove_socket(std::uint16_t const id)
	{
		auto const i = m_utp_sockets.find(id);
		if (i == m_utp_sockets.end()) return;
		if (m_last_socket == i->second.get()) m_last_socket = nullptr;
		if (m_deferred_ack == i->second.get()) m_deferred_ack = nullptr;
		m_utp_sockets.erase(i);
	}